

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O0

w3Tag __thiscall w3Module::read_valuetype(w3Module *this,uint8_t **cursor)

{
  byte bVar1;
  string local_40;
  uint local_1c;
  uint8_t **ppuStack_18;
  uint32_t value_type;
  uint8_t **cursor_local;
  w3Module *this_local;
  
  ppuStack_18 = cursor;
  cursor_local = (uint8_t **)this;
  bVar1 = read_byte(this,cursor);
  local_1c = (uint)bVar1;
  if (3 < local_1c - 0x7c) {
    StringFormat_abi_cxx11_(&local_40,"invalid w3Tag:%X",(ulong)local_1c);
    ThrowString(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (w3Tag)local_1c;
}

Assistant:

w3Tag w3Module::read_valuetype (uint8_t** cursor)
{
    const uint32_t value_type = read_byte (cursor);
    switch (value_type)
    {
    default:
        ThrowString (StringFormat ("invalid w3Tag:%X", value_type));
        break;
    case Tag_i32:
    case Tag_i64:
    case Tag_f32:
    case Tag_f64:
        break;
    }
    return (w3Tag)value_type;
}